

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

size_t __thiscall clickhouse::BufferedInput::DoRead(BufferedInput *this,void *buf,size_t len)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_00;
  ArrayInput *pAVar3;
  
  if ((this->array_input_).len_ == 0) {
    pAVar3 = (ArrayInput *)this->slave_;
    puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    UNRECOVERED_JUMPTABLE = (pAVar3->super_ZeroCopyInput).super_InputStream._vptr_InputStream[2];
    if ((ulong)((long)(this->buffer_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) >> 1 < len)
    goto LAB_0013670e;
    iVar2 = (*UNRECOVERED_JUMPTABLE)(pAVar3,puVar1);
    (this->array_input_).data_ = puVar1;
    (this->array_input_).len_ = CONCAT44(extraout_var,iVar2);
  }
  pAVar3 = &this->array_input_;
  UNRECOVERED_JUMPTABLE = (pAVar3->super_ZeroCopyInput).super_InputStream._vptr_InputStream[2];
LAB_0013670e:
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pAVar3,buf,len);
  return CONCAT44(extraout_var_00,iVar2);
}

Assistant:

size_t BufferedInput::DoRead(void* buf, size_t len) {
    if (array_input_.Exhausted()) {
        if (len > buffer_.size() / 2) {
            return slave_->Read(buf, len);
        }

        array_input_.Reset(
            buffer_.data(), slave_->Read(buffer_.data(), buffer_.size())
        );
    }

    return array_input_.Read(buf, len);
}